

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_get_crt_ext(uchar **p,uchar *end,mbedtls_x509_crt *crt,mbedtls_x509_crt_ext_cb_t cb,
                    void *p_ctx)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  uint uVar6;
  bool bVar7;
  undefined1 auStack_88 [8];
  mbedtls_x509_buf extn_oid;
  size_t local_68;
  size_t len;
  uint local_54;
  mbedtls_x509_crt *pmStack_50;
  int ext_type;
  uchar *local_48;
  uint local_3c;
  uchar *puStack_38;
  int is_critical;
  
  if (*p == end) {
    uVar2 = 0;
  }
  else {
    uVar2 = mbedtls_x509_get_ext(p,end,&crt->v3_ext,3);
    if (uVar2 == 0) {
      puVar4 = (crt->v3_ext).p + (crt->v3_ext).len;
      puVar5 = *p;
      if (puVar5 < puVar4) {
        len = (size_t)cb;
        pmStack_50 = crt;
        puStack_38 = puVar4;
        do {
          uVar2 = (uint)cb;
          auStack_88 = (undefined1  [8])0x0;
          extn_oid.tag = 0;
          extn_oid._4_4_ = 0;
          extn_oid.len = 0;
          local_3c = 0;
          local_54 = 0;
          iVar3 = mbedtls_asn1_get_tag(p,puVar4,&local_68,0x30);
          if (iVar3 != 0) {
            bVar7 = true;
            uVar6 = iVar3 - 0x2500;
            goto LAB_00215b5c;
          }
          puVar5 = *p + local_68;
          iVar3 = mbedtls_asn1_get_tag(p,puVar5,(size_t *)&extn_oid,6);
          if (iVar3 != 0) {
LAB_00215b4b:
            uVar6 = iVar3 - 0x2500;
LAB_00215b58:
            bVar7 = true;
            puVar4 = puStack_38;
            goto LAB_00215b5c;
          }
          auStack_88._0_4_ = 6;
          extn_oid.len = (size_t)*p;
          *p = (uchar *)(extn_oid.len + extn_oid._0_8_);
          iVar3 = mbedtls_asn1_get_bool(p,puVar5,(int *)&local_3c);
          if (((iVar3 != -0x62) && (iVar3 != 0)) ||
             (iVar3 = mbedtls_asn1_get_tag(p,puVar5,&local_68,4), iVar3 != 0)) goto LAB_00215b4b;
          puVar1 = *p;
          puVar4 = puVar1 + local_68;
          bVar7 = true;
          uVar6 = 0xffffda9a;
          if (puVar4 != puVar5) goto LAB_00215b58;
          local_48 = puVar4;
          iVar3 = mbedtls_oid_get_x509_ext_type((mbedtls_asn1_buf *)auStack_88,(int *)&local_54);
          puVar4 = puStack_38;
          if (iVar3 != 0) {
            if (len == 0) {
              *p = local_48;
              bVar7 = local_3c != 0;
              uVar6 = uVar2;
              if (bVar7) {
                uVar6 = 0xffffda9e;
              }
            }
            else {
              uVar6 = (*(code *)len)(p_ctx,pmStack_50,auStack_88,local_3c,*p,local_48);
              if ((uVar6 == 0) || (local_3c == 0)) {
                *p = local_48;
                bVar7 = false;
                uVar6 = uVar2;
              }
            }
            goto LAB_00215b5c;
          }
          uVar6 = 0xffffdb00;
          if ((local_54 & pmStack_50->ext_types) != 0) goto LAB_00215b58;
          pmStack_50->ext_types = pmStack_50->ext_types | local_54;
          if (0x1f < (int)local_54) {
            if ((int)local_54 < 0x800) {
              if (local_54 == 0x20) {
                uVar6 = mbedtls_x509_get_subject_alt_name(p,local_48,&crt->subject_alt_names);
                puVar4 = puStack_38;
                local_3c = uVar6;
              }
              else {
                if (local_54 != 0x100) goto switchD_00215c90_caseD_3;
                uVar6 = x509_get_basic_constraints(p,local_48,&crt->ca_istrue,&crt->max_pathlen);
                puVar4 = puStack_38;
                local_3c = uVar6;
              }
            }
            else if (local_54 == 0x800) {
              iVar3 = mbedtls_asn1_get_sequence_of(p,local_48,&crt->ext_key_usage,6);
              puVar4 = puStack_38;
              if (iVar3 == 0) {
                uVar6 = 0;
                local_3c = uVar6;
                if ((pmStack_50->ext_key_usage).buf.p == (uchar *)0x0) {
                  uVar6 = 0xffffda9c;
                  local_3c = uVar6;
                }
              }
              else {
                uVar6 = iVar3 - 0x2500;
                local_3c = uVar6;
              }
            }
            else {
              if (local_54 != 0x10000) goto switchD_00215c90_caseD_3;
              uVar6 = mbedtls_x509_get_ns_cert_type(p,local_48,&crt->ns_cert_type);
              puVar4 = puStack_38;
              local_3c = uVar6;
            }
            goto joined_r0x00215da7;
          }
          switch(local_54) {
          case 1:
            uVar6 = x509_get_authority_key_id(p,local_48,&crt->authority_key_id);
            puVar4 = puStack_38;
            local_3c = uVar6;
            break;
          case 2:
            uVar6 = x509_get_subject_key_id(p,puVar5,&crt->subject_key_id);
            puVar4 = puStack_38;
            local_3c = uVar6;
            break;
          default:
switchD_00215c90_caseD_3:
            uVar6 = 0xffffdf80;
            if (local_3c != 0) goto LAB_00215b5c;
            *p = local_48;
            goto LAB_00215e6c;
          case 4:
            uVar6 = mbedtls_x509_get_key_usage(p,local_48,&crt->key_usage);
            puVar4 = puStack_38;
            local_3c = uVar6;
            break;
          case 8:
            uVar6 = x509_get_certificate_policies(p,local_48,&crt->certificate_policies);
            puVar4 = puStack_38;
            if ((uVar6 != 0) &&
               ((uVar6 != 0xffffdf80 || len == 0 ||
                (iVar3 = (*(code *)len)(p_ctx,pmStack_50,auStack_88,local_3c,puVar1,local_48),
                iVar3 != 0)))) {
              if (uVar6 != 0xffffdf80) goto LAB_00215b5c;
              break;
            }
            goto LAB_00215e6c;
          }
joined_r0x00215da7:
          if (local_3c == 0) {
LAB_00215e6c:
            bVar7 = false;
            uVar6 = uVar2;
          }
LAB_00215b5c:
          if (bVar7) {
            return uVar6;
          }
          puVar5 = *p;
          cb = (mbedtls_x509_crt_ext_cb_t)(ulong)uVar6;
        } while (puVar5 < puVar4);
      }
      uVar2 = 0xffffda9a;
      if (puVar5 == puVar4) {
        uVar2 = 0;
      }
    }
  }
  return uVar2;
}

Assistant:

static int x509_get_crt_ext(unsigned char **p,
                            const unsigned char *end,
                            mbedtls_x509_crt *crt,
                            mbedtls_x509_crt_ext_cb_t cb,
                            void *p_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    unsigned char *end_ext_data, *start_ext_octet, *end_ext_octet;

    if (*p == end) {
        return 0;
    }

    if ((ret = mbedtls_x509_get_ext(p, end, &crt->v3_ext, 3)) != 0) {
        return ret;
    }

    end = crt->v3_ext.p + crt->v3_ext.len;
    while (*p < end) {
        /*
         * Extension  ::=  SEQUENCE  {
         *      extnID      OBJECT IDENTIFIER,
         *      critical    BOOLEAN DEFAULT FALSE,
         *      extnValue   OCTET STRING  }
         */
        mbedtls_x509_buf extn_oid = { 0, 0, NULL };
        int is_critical = 0; /* DEFAULT FALSE */
        int ext_type = 0;

        if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                        MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        end_ext_data = *p + len;

        /* Get extension ID */
        if ((ret = mbedtls_asn1_get_tag(p, end_ext_data, &extn_oid.len,
                                        MBEDTLS_ASN1_OID)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        extn_oid.tag = MBEDTLS_ASN1_OID;
        extn_oid.p = *p;
        *p += extn_oid.len;

        /* Get optional critical */
        if ((ret = mbedtls_asn1_get_bool(p, end_ext_data, &is_critical)) != 0 &&
            (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG)) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        /* Data should be octet string type */
        if ((ret = mbedtls_asn1_get_tag(p, end_ext_data, &len,
                                        MBEDTLS_ASN1_OCTET_STRING)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        start_ext_octet = *p;
        end_ext_octet = *p + len;

        if (end_ext_octet != end_ext_data) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                     MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
        }

        /*
         * Detect supported extensions
         */
        ret = mbedtls_oid_get_x509_ext_type(&extn_oid, &ext_type);

        if (ret != 0) {
            /* Give the callback (if any) a chance to handle the extension */
            if (cb != NULL) {
                ret = cb(p_ctx, crt, &extn_oid, is_critical, *p, end_ext_octet);
                if (ret != 0 && is_critical) {
                    return ret;
                }
                *p = end_ext_octet;
                continue;
            }

            /* No parser found, skip extension */
            *p = end_ext_octet;

            if (is_critical) {
                /* Data is marked as critical: fail */
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                         MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
            }
            continue;
        }

        /* Forbid repeated extensions */
        if ((crt->ext_types & ext_type) != 0) {
            return MBEDTLS_ERR_X509_INVALID_EXTENSIONS;
        }

        crt->ext_types |= ext_type;

        switch (ext_type) {
            case MBEDTLS_X509_EXT_BASIC_CONSTRAINTS:
                /* Parse basic constraints */
                if ((ret = x509_get_basic_constraints(p, end_ext_octet,
                                                      &crt->ca_istrue, &crt->max_pathlen)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_KEY_USAGE:
                /* Parse key usage */
                if ((ret = mbedtls_x509_get_key_usage(p, end_ext_octet,
                                                      &crt->key_usage)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE:
                /* Parse extended key usage */
                if ((ret = x509_get_ext_key_usage(p, end_ext_octet,
                                                  &crt->ext_key_usage)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_SUBJECT_KEY_IDENTIFIER:
                /* Parse subject key identifier */
                if ((ret = x509_get_subject_key_id(p, end_ext_data,
                                                   &crt->subject_key_id)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_AUTHORITY_KEY_IDENTIFIER:
                /* Parse authority key identifier */
                if ((ret = x509_get_authority_key_id(p, end_ext_octet,
                                                     &crt->authority_key_id)) != 0) {
                    return ret;
                }
                break;
            case MBEDTLS_X509_EXT_SUBJECT_ALT_NAME:
                /* Parse subject alt name
                 * SubjectAltName ::= GeneralNames
                 */
                if ((ret = mbedtls_x509_get_subject_alt_name(p, end_ext_octet,
                                                             &crt->subject_alt_names)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_NS_CERT_TYPE:
                /* Parse netscape certificate type */
                if ((ret = mbedtls_x509_get_ns_cert_type(p, end_ext_octet,
                                                         &crt->ns_cert_type)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_OID_X509_EXT_CERTIFICATE_POLICIES:
                /* Parse certificate policies type */
                if ((ret = x509_get_certificate_policies(p, end_ext_octet,
                                                         &crt->certificate_policies)) != 0) {
                    /* Give the callback (if any) a chance to handle the extension
                     * if it contains unsupported policies */
                    if (ret == MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE && cb != NULL &&
                        cb(p_ctx, crt, &extn_oid, is_critical,
                           start_ext_octet, end_ext_octet) == 0) {
                        break;
                    }

                    if (is_critical) {
                        return ret;
                    } else
                    /*
                     * If MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE is returned, then we
                     * cannot interpret or enforce the policy. However, it is up to
                     * the user to choose how to enforce the policies,
                     * unless the extension is critical.
                     */
                    if (ret != MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) {
                        return ret;
                    }
                }
                break;

            default:
                /*
                 * If this is a non-critical extension, which the oid layer
                 * supports, but there isn't an x509 parser for it,
                 * skip the extension.
                 */
                if (is_critical) {
                    return MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE;
                } else {
                    *p = end_ext_octet;
                }
        }
    }

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}